

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

void tbx_set_meta(tbx_t *tbx)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  undefined8 uVar5;
  void *__ptr;
  size_t sVar6;
  uint8_t *meta;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  
  puVar3 = (uint *)tbx->dict;
  uVar1 = puVar3[1];
  __ptr = malloc((ulong)uVar1 << 3);
  uVar2 = *puVar3;
  bVar9 = 0;
  iVar10 = 0;
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    if ((*(uint *)(*(long *)(puVar3 + 4) + (uVar7 >> 4 & 0xfffffff) * 4) >> (bVar9 & 0x1e) & 3) == 0
       ) {
      pcVar4 = *(char **)(*(long *)(puVar3 + 6) + uVar7 * 8);
      *(char **)((long)__ptr + *(long *)(*(long *)(puVar3 + 8) + uVar7 * 8) * 8) = pcVar4;
      sVar6 = strlen(pcVar4);
      iVar10 = iVar10 + (int)sVar6 + 1;
    }
    bVar9 = bVar9 + 2;
  }
  meta = (uint8_t *)malloc((long)(iVar10 + 0x1c));
  uVar5 = *(undefined8 *)&(tbx->conf).bc;
  *(undefined8 *)meta = *(undefined8 *)&tbx->conf;
  *(undefined8 *)(meta + 8) = uVar5;
  *(undefined8 *)(meta + 0x10) = *(undefined8 *)&(tbx->conf).meta_char;
  *(int *)(meta + 0x18) = iVar10;
  iVar10 = 0x1c;
  for (lVar8 = 0; lVar8 < (int)uVar1; lVar8 = lVar8 + 1) {
    pcVar4 = *(char **)((long)__ptr + lVar8 * 8);
    sVar6 = strlen(pcVar4);
    memcpy(meta + iVar10,pcVar4,(long)((int)sVar6 + 1));
    iVar10 = iVar10 + (int)sVar6 + 1;
  }
  free(__ptr);
  hts_idx_set_meta(tbx->idx,iVar10,meta,0);
  return;
}

Assistant:

void tbx_set_meta(tbx_t *tbx)
{
    int i, l = 0, l_nm;
    uint32_t x[7];
    char **name;
    uint8_t *meta;
    khint_t k;
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;

    memcpy(x, &tbx->conf, 24);
    name = (char**)malloc(sizeof(char*) * kh_size(d));
    for (k = kh_begin(d), l = 0; k != kh_end(d); ++k) {
        if (!kh_exist(d, k)) continue;
        name[kh_val(d, k)] = (char*)kh_key(d, k);
        l += strlen(kh_key(d, k)) + 1; // +1 to include '\0'
    }
    l_nm = x[6] = l;
    meta = (uint8_t*)malloc(l_nm + 28);
    if (ed_is_big())
        for (i = 0; i < 7; ++i)
            x[i] = ed_swap_4(x[i]);
    memcpy(meta, x, 28);
    for (l = 28, i = 0; i < (int)kh_size(d); ++i) {
        int x = strlen(name[i]) + 1;
        memcpy(meta + l, name[i], x);
        l += x;
    }
    free(name);
    hts_idx_set_meta(tbx->idx, l, meta, 0);
}